

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_sse_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  if (len < 0x8000) {
    iVar5 = 0;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    uVar6 = 0;
  }
  else {
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar2 = vpmovzxbw_avx(ZEXT816(0x8040201008040201));
    auVar9 = vmovdqa64_avx512vl(_DAT_001110b0);
    auVar16._8_8_ = 0x80800d0c80800b0a;
    auVar16._0_8_ = 0x80800d0c80800b0a;
    uVar6 = 0;
    iVar5 = 0;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    do {
      lVar8 = 0;
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        uVar1 = *(undefined2 *)((long)data + lVar8);
        auVar18._2_2_ = uVar1;
        auVar18._0_2_ = uVar1;
        auVar18._4_2_ = uVar1;
        auVar18._6_2_ = uVar1;
        auVar18._8_2_ = uVar1;
        auVar18._10_2_ = uVar1;
        auVar18._12_2_ = uVar1;
        auVar18._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar18,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar14._0_16_,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 2);
        auVar19._2_2_ = uVar1;
        auVar19._0_2_ = uVar1;
        auVar19._4_2_ = uVar1;
        auVar19._6_2_ = uVar1;
        auVar19._8_2_ = uVar1;
        auVar19._10_2_ = uVar1;
        auVar19._12_2_ = uVar1;
        auVar19._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar19,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 4);
        auVar20._2_2_ = uVar1;
        auVar20._0_2_ = uVar1;
        auVar20._4_2_ = uVar1;
        auVar20._6_2_ = uVar1;
        auVar20._8_2_ = uVar1;
        auVar20._10_2_ = uVar1;
        auVar20._12_2_ = uVar1;
        auVar20._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar20,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 6);
        auVar21._2_2_ = uVar1;
        auVar21._0_2_ = uVar1;
        auVar21._4_2_ = uVar1;
        auVar21._6_2_ = uVar1;
        auVar21._8_2_ = uVar1;
        auVar21._10_2_ = uVar1;
        auVar21._12_2_ = uVar1;
        auVar21._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar21,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 8);
        auVar22._2_2_ = uVar1;
        auVar22._0_2_ = uVar1;
        auVar22._4_2_ = uVar1;
        auVar22._6_2_ = uVar1;
        auVar22._8_2_ = uVar1;
        auVar22._10_2_ = uVar1;
        auVar22._12_2_ = uVar1;
        auVar22._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar22,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 10);
        auVar23._2_2_ = uVar1;
        auVar23._0_2_ = uVar1;
        auVar23._4_2_ = uVar1;
        auVar23._6_2_ = uVar1;
        auVar23._8_2_ = uVar1;
        auVar23._10_2_ = uVar1;
        auVar23._12_2_ = uVar1;
        auVar23._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar23,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        uVar1 = *(undefined2 *)((long)data + lVar8 + 0xc);
        auVar24._2_2_ = uVar1;
        auVar24._0_2_ = uVar1;
        auVar24._4_2_ = uVar1;
        auVar24._6_2_ = uVar1;
        auVar24._8_2_ = uVar1;
        auVar24._10_2_ = uVar1;
        auVar24._12_2_ = uVar1;
        auVar24._14_2_ = uVar1;
        auVar11 = vpand_avx(auVar24,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        auVar10 = vpbroadcastw_avx512vl(ZEXT216(*(ushort *)((long)data + lVar8 + 0x1c)));
        auVar11 = vpandq_avx512vl(auVar10,_DAT_00111090);
        auVar11 = vpcmpeqw_avx(auVar11,_DAT_00111090);
        auVar3 = vpsubw_avx(auVar3,auVar11);
        auVar14 = ZEXT1664(auVar3);
        auVar11 = vpand_avx(auVar18,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar17._0_16_,auVar11);
        auVar11 = vpand_avx(auVar19,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpand_avx(auVar20,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpand_avx(auVar21,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpand_avx(auVar22,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpand_avx(auVar23,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpand_avx(auVar24,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar18 = vpsubw_avx(auVar18,auVar11);
        auVar11 = vpandq_avx512vl(auVar10,auVar2);
        auVar11 = vpcmpeqw_avx(auVar11,auVar2);
        auVar11 = vpsubw_avx(auVar18,auVar11);
        auVar17 = ZEXT1664(auVar11);
        lVar8 = lVar8 + 0x10;
      } while ((int)lVar8 != 0x10000);
      iVar7 = vpextrw_avx(auVar11,0);
      iVar5 = iVar5 + iVar7;
      auVar11 = vpalignr_avx(auVar3,auVar11,2);
      auVar4 = vpmovzxwd_avx2(auVar11);
      auVar4 = vpaddd_avx2(auVar4,auVar13._0_32_);
      auVar13 = ZEXT3264(auVar4);
      auVar11 = vpshufb_avx512vl(auVar3,auVar9);
      auVar11 = vpaddd_avx(auVar11,auVar12._0_16_);
      auVar12 = ZEXT1664(auVar11);
      auVar11 = vpshufb_avx(auVar3,auVar16);
      auVar11 = vpaddd_avx(auVar11,auVar15._0_16_);
      auVar15 = ZEXT1664(auVar11);
      vpextrw_avx(auVar3,7);
      uVar6 = uVar6 + 1;
      data = data + 0x8000;
    } while (uVar6 != len >> 0xf);
    uVar6 = len & 0xffff8000;
    auVar14 = valignd_avx512f(auVar13,auVar13,0xf);
    auVar13._60_4_ = 0;
    auVar13._0_60_ = auVar14._4_60_;
    auVar14 = vpmovsxbd_avx512f(_DAT_001110d0);
    auVar12 = vpermi2d_avx512f(auVar14,auVar13 << 0x20,auVar12);
    auVar13 = vpmovsxbd_avx512f(_DAT_001110e0);
    auVar12 = vpermi2d_avx512f(auVar13,auVar12,auVar15);
    auVar13 = vpbroadcastd_avx512f();
    auVar15._60_4_ = auVar13._60_4_;
    auVar15._0_60_ = auVar12._0_60_;
  }
  auVar2 = vpinsrd_avx(auVar15._0_16_,iVar5,0);
  auVar12 = vinserti32x4_avx512f(auVar15,auVar2,0);
  if (uVar6 < len) {
    auVar13 = vpmovsxbd_avx512f(_DAT_00111080);
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar14 = vpbroadcastd_avx512f();
      auVar14 = vpsrlvd_avx512f(auVar14,auVar13);
      auVar14 = vpandd_avx512f(auVar14,auVar15);
      auVar12 = vpaddd_avx512f(auVar14,auVar12);
      uVar6 = uVar6 + 1;
    } while (uVar6 < len);
  }
  auVar12 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])flags = auVar12;
  return 0;
}

Assistant:

int pospopcnt_u16_sse_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m128i counterLo = _mm_set1_epi16(0);
    __m128i counterHi = _mm_set1_epi16(0);
    const __m128i one_mask =  _mm_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m128i masksLo = _mm_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                          1 << 11, 1 << 10, 1 << 9,  1 << 8);
    const __m128i masksHi = _mm_set_epi16(1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                          1 << 3,  1 << 2,  1 << 1,  1 << 0);

    uint32_t out_counters[16] = {0};
    const __m128i* data_vectors = (const __m128i*)(data);
    const uint32_t n_cycles = len / 8;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE_LO(idx) counterLo = _mm_add_epi16(counterLo, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksLo), masksLo), one_mask));
#define UPDATE_HI(idx) counterHi = _mm_add_epi16(counterHi, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksHi), masksHi), one_mask));
#define BLOCK {                                         \
    UPDATE_LO(0) UPDATE_LO(1) UPDATE_LO(2) UPDATE_LO(3) \
    UPDATE_LO(4) UPDATE_LO(5) UPDATE_LO(6) UPDATE_LO(7) \
    UPDATE_HI(0) UPDATE_HI(1) UPDATE_HI(2) UPDATE_HI(3) \
    UPDATE_HI(4) UPDATE_HI(5) UPDATE_HI(6) UPDATE_HI(7) \
}
#define UH(idx) out_counters[idx] += _mm_extract_epi16(counterLo, idx - 8);
#define UL(idx) out_counters[idx] += _mm_extract_epi16(counterHi, idx);

    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum (unroll to prevent possible compiler errors
        // regarding constness of parameter N in _mm_extract_epi16).
        UL(0)  UL(1)  UL(2)  UL(3)
        UL(4)  UL(5)  UL(6)  UL(7)
        UH(8)  UH(9)  UH(10) UH(11)
        UH(12) UH(13) UH(14) UH(15)
        counterLo = _mm_set1_epi16(0);
        counterHi = _mm_set1_epi16(0);
    }

#undef UL
#undef UH
#undef BLOCK
#undef UPDATE_HI
#undef UPDATE_LO

    // residual
    for (int i = pos*8; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}